

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<Replace>::moveAppend
          (QGenericArrayOps<Replace> *this,Replace *b,Replace *e)

{
  Replace *pRVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  
  if ((b != e) && (b < e)) {
    pRVar1 = (this->super_QArrayDataPointer<Replace>).ptr;
    qVar5 = (this->super_QArrayDataPointer<Replace>).size;
    do {
      pDVar2 = (b->in).d.d;
      (b->in).d.d = (Data *)0x0;
      pRVar1[qVar5].in.d.d = pDVar2;
      pcVar3 = (b->in).d.ptr;
      (b->in).d.ptr = (char16_t *)0x0;
      pRVar1[qVar5].in.d.ptr = pcVar3;
      qVar4 = (b->in).d.size;
      (b->in).d.size = 0;
      pRVar1[qVar5].in.d.size = qVar4;
      pDVar2 = (b->out).d.d;
      (b->out).d.d = (Data *)0x0;
      pRVar1[qVar5].out.d.d = pDVar2;
      pcVar3 = (b->out).d.ptr;
      (b->out).d.ptr = (char16_t *)0x0;
      pRVar1[qVar5].out.d.ptr = pcVar3;
      qVar4 = (b->out).d.size;
      (b->out).d.size = 0;
      pRVar1[qVar5].out.d.size = qVar4;
      b = b + 1;
      qVar5 = (this->super_QArrayDataPointer<Replace>).size + 1;
      (this->super_QArrayDataPointer<Replace>).size = qVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }